

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O1

void std_array_suite::ctor(void)

{
  undefined8 local_30;
  undefined4 local_24;
  
  boost::detail::test_impl
            ("span.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x820,"void std_array_suite::ctor()",true);
  boost::detail::test_impl
            ("!span.full()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x821,"void std_array_suite::ctor()",true);
  local_30 = 0;
  local_24 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x822,"void std_array_suite::ctor()",&local_30,&local_24);
  local_30 = 4;
  local_24 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x823,"void std_array_suite::ctor()",&local_30,&local_24);
  return;
}

Assistant:

void ctor()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    BOOST_TEST(span.empty());
    BOOST_TEST(!span.full());
    BOOST_TEST_EQ(span.size(), 0);
    BOOST_TEST_EQ(span.capacity(), 4);
}